

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O2

EVP_PKEY_ASN1_METHOD * parse_key_type(CBS *cbs)

{
  EVP_PKEY_ASN1_METHOD *pEVar1;
  int iVar2;
  long lVar3;
  CBS oid;
  
  iVar2 = CBS_get_asn1(cbs,&oid,6);
  if (iVar2 != 0) {
    for (lVar3 = 0; lVar3 != 0x28; lVar3 = lVar3 + 8) {
      pEVar1 = *(EVP_PKEY_ASN1_METHOD **)((long)kASN1Methods + lVar3);
      if (oid.len == pEVar1->oid_len) {
        if (pEVar1->oid_len == 0) {
          return pEVar1;
        }
        iVar2 = bcmp(oid.data,pEVar1->oid,oid.len);
        if (iVar2 == 0) {
          return pEVar1;
        }
      }
    }
  }
  return (EVP_PKEY_ASN1_METHOD *)0x0;
}

Assistant:

static const EVP_PKEY_ASN1_METHOD *parse_key_type(CBS *cbs) {
  CBS oid;
  if (!CBS_get_asn1(cbs, &oid, CBS_ASN1_OBJECT)) {
    return NULL;
  }

  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(kASN1Methods); i++) {
    const EVP_PKEY_ASN1_METHOD *method = kASN1Methods[i];
    if (CBS_len(&oid) == method->oid_len &&
        OPENSSL_memcmp(CBS_data(&oid), method->oid, method->oid_len) == 0) {
      return method;
    }
  }

  return NULL;
}